

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bluetooth_packet.c
# Opt level: O3

uint8_t try_clock(int clock,btbb_packet *pkt)

{
  uint8_t host_order_1;
  int iVar1;
  int i;
  long lVar2;
  byte bVar3;
  uint16_t host_order;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  byte bVar7;
  bool bVar8;
  byte local_58 [8];
  char header [18];
  byte abStack_38 [8];
  char unwhitened [18];
  
  iVar1 = unfec13(pkt->symbols + 0x44,(char *)local_58,0x12);
  if (iVar1 == 0) {
    bVar7 = 0;
  }
  else {
    uVar6 = (uint)"cU\x112f:l-\\> vX\vP\x02%E7\b\x14(Jr\x0fj\x1eN5H\x1c\x1aD\a\'qiMG\x19T19,=u\n\x01{|\x16}o\x17*~\x06pL\x180+t"
                  [clock & 0x3f];
    uVar4 = pkt->flags;
    lVar2 = 0;
    do {
      bVar7 = local_58[lVar2];
      if ((uVar4 & 1) != 0) {
        bVar7 = bVar7 ^ "\x01\x01\x01"[uVar6 % 0x7f];
      }
      abStack_38[lVar2] = bVar7;
      uVar6 = uVar6 % 0x7f + 1;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x12);
    lVar2 = 0;
    uVar4 = 0;
    do {
      bVar7 = (byte)lVar2 & 0x1f;
      uVar4 = uVar4 | (int)(char)abStack_38[lVar2] << bVar7;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 10);
    lVar2 = 0;
    uVar6 = 0 << bVar7;
    do {
      uVar6 = (uint)(byte)((byte)uVar6 | unwhitened[lVar2 + 2] << ((byte)lVar2 & 0x1f));
      lVar2 = lVar2 + 1;
    } while (lVar2 != 8);
    uVar5 = 9;
    do {
      bVar3 = (byte)uVar6;
      bVar7 = bVar3 ^ 0x65;
      if (-1 < (char)bVar3) {
        bVar7 = bVar3;
      }
      uVar6 = (uint)(byte)(((uVar4 & 0xffff) >> (uVar5 & 0x1f) & 1) != 0 ^ bVar7 >> 7) +
              (uint)bVar7 * 2;
      bVar8 = uVar5 != 0;
      uVar5 = uVar5 - 1;
    } while (bVar8);
    bVar7 = (byte)uVar6 << 4 | (byte)uVar6 >> 4;
    bVar7 = bVar7 >> 2 & 0x33 | (bVar7 & 0x33) << 2;
    bVar7 = bVar7 >> 1 & 0x55 | (bVar7 & 0x55) * '\x02';
    pkt->UAP = bVar7;
    lVar2 = 0;
    bVar3 = 0;
    do {
      bVar3 = bVar3 | abStack_38[lVar2 + 3] << ((byte)lVar2 & 0x1f);
      lVar2 = lVar2 + 1;
    } while (lVar2 != 4);
    pkt->packet_type = bVar3;
  }
  return bVar7;
}

Assistant:

uint8_t try_clock(int clock, btbb_packet* pkt)
{
	/* skip 72 bit access code */
	char *stream = pkt->symbols + 68;
	/* 18 bit packet header */
	char header[18];
	char unwhitened[18];

	if (!unfec13(stream, header, 18))
		return 0;
	unwhiten(header, unwhitened, clock, 18, 0, pkt);
	uint16_t hdr_data = air_to_host16(unwhitened, 10);
	uint8_t hec = air_to_host8(&unwhitened[10], 8);
	pkt->UAP = uap_from_hec(hdr_data, hec);
	pkt->packet_type = air_to_host8(&unwhitened[3], 4);

	return pkt->UAP;
}